

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O2

void __thiscall HalfMesh::Mesh::establish_connectivity(Mesh *this)

{
  uint uVar1;
  __node_base *p_Var2;
  __node_base *p_Var3;
  reference ppHVar4;
  reference ppEVar5;
  
  p_Var2 = &(this->face_to_one_half_edge_map)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    p_Var2[1]._M_nxt[4]._M_nxt =
         *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
  }
  p_Var3 = &(this->edge_to_one_half_edge_map)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    p_Var3[1]._M_nxt[3]._M_nxt =
         *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
  }
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(this->all_half_edges).
                    super__Vector_base<HalfMesh::HalfEdge_*,_std::allocator<HalfMesh::HalfEdge_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->all_half_edges).
                    super__Vector_base<HalfMesh::HalfEdge_*,_std::allocator<HalfMesh::HalfEdge_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
    ppHVar4 = std::vector<HalfMesh::HalfEdge_*,_std::allocator<HalfMesh::HalfEdge_*>_>::at
                        (&this->all_half_edges,(ulong)uVar1);
    (*ppHVar4)->boundary_half_edge = (*ppHVar4)->opposing_half_edge == 0xffffffff;
  }
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(this->all_edges).
                    super__Vector_base<HalfMesh::Edge_*,_std::allocator<HalfMesh::Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->all_edges).
                    super__Vector_base<HalfMesh::Edge_*,_std::allocator<HalfMesh::Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
    ppEVar5 = std::vector<HalfMesh::Edge_*,_std::allocator<HalfMesh::Edge_*>_>::at
                        (&this->all_edges,(ulong)uVar1);
    (*ppEVar5)->boundary_edge = (*ppEVar5)->one_half_edge->boundary_half_edge;
  }
  return;
}

Assistant:

void establish_connectivity() {
            for (auto iter = face_to_one_half_edge_map.begin(); iter != face_to_one_half_edge_map.end(); ++iter) {
                Face *face = iter->first;
                HalfEdge *halfEdge = iter->second;
                face->set_one_half_edge(halfEdge);
            }
            for (auto iter = edge_to_one_half_edge_map.begin(); iter != edge_to_one_half_edge_map.end(); ++iter) {
                Edge *edge = iter->first;
                HalfEdge *halfEdge = iter->second;
                edge->set_one_half_edge(halfEdge);
            }
            for (unsigned int i = 0; i < all_half_edges.size(); ++i) {
                HalfEdge *half_edge = all_half_edges.at(i);
                if (half_edge->get_opposing_half_edge() == std::numeric_limits<unsigned int>::max()) {
                    half_edge->set_boundary(true);
                } else {
                    half_edge->set_boundary(false);
                }
            }
            for (unsigned int i = 0; i < all_edges.size(); ++i) {
                Edge *edge = all_edges.at(i);
                HalfEdge *halfEdge = edge->get_one_half_edge();
                if (halfEdge->is_boundary()) {
                    edge->set_boundary(true);
                } else {
                    edge->set_boundary(false);
                }

            }
        }